

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void anon_unknown.dwarf_22bf96::GetAndNumberControlGraphNodesDfs
               (SmallArray<VmBlock_*,_32U> *blocksPostOrder,VmBlock *block,uint *preOrder,
               uint *postOrder)

{
  VmBlock *block_00;
  uint uVar1;
  ulong uVar2;
  
  uVar1 = *preOrder;
  *preOrder = uVar1 + 1;
  block->controlGraphPreOrderId = uVar1;
  block->visited = true;
  uVar1 = (block->successors).count;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      block_00 = (block->successors).data[uVar2];
      if (block_00->visited == false) {
        GetAndNumberControlGraphNodesDfs(blocksPostOrder,block_00,preOrder,postOrder);
        uVar1 = (block->successors).count;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  uVar1 = *postOrder;
  *postOrder = uVar1 + 1;
  block->controlGraphPostOrderId = uVar1;
  if (blocksPostOrder->count == blocksPostOrder->max) {
    SmallArray<VmBlock_*,_32U>::grow(blocksPostOrder,blocksPostOrder->count);
  }
  if (blocksPostOrder->data != (VmBlock **)0x0) {
    uVar1 = blocksPostOrder->count;
    blocksPostOrder->count = uVar1 + 1;
    blocksPostOrder->data[uVar1] = block;
    return;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,"void SmallArray<VmBlock *, 32>::push_back(const T &) [T = VmBlock *, N = 32]"
               );
}

Assistant:

void GetAndNumberControlGraphNodesDfs(SmallArray<VmBlock*, 32>& blocksPostOrder, VmBlock* block, unsigned &preOrder, unsigned &postOrder)
	{
		block->controlGraphPreOrderId = preOrder++;

		block->visited = true;

		for(unsigned i = 0; i < block->successors.size(); i++)
		{
			VmBlock *successor = block->successors[i];

			if(!successor->visited)
				GetAndNumberControlGraphNodesDfs(blocksPostOrder, successor, preOrder, postOrder);
		}

		block->controlGraphPostOrderId = postOrder++;

		blocksPostOrder.push_back(block);
	}